

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

void __thiscall
icu_63::NFRule::parseRuleDescriptor(NFRule *this,UnicodeString *description,UErrorCode *status)

{
  short sVar1;
  UBool UVar2;
  int8_t iVar3;
  char16_t cVar4;
  char16_t cVar5;
  int16_t iVar6;
  int iVar7;
  undefined4 uVar8;
  long newBaseValue;
  int iVar9;
  int offset;
  ConstChar16Ptr local_c0;
  ConstChar16Ptr local_b8;
  ConstChar16Ptr local_b0;
  UnicodeString descriptor;
  
  iVar7 = UnicodeString::indexOf(description,L':');
  if (iVar7 == -1) goto LAB_00250480;
  descriptor.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003d8fe8;
  descriptor.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::setTo(&descriptor,description,0,iVar7);
  do {
    iVar7 = iVar7 + 1;
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar9 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar9 = (int)sVar1 >> 5;
    }
    if (iVar9 <= iVar7) break;
    cVar4 = UnicodeString::doCharAt(description,iVar7);
    UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar4);
  } while (UVar2 != '\0');
  UnicodeString::removeBetween(description,0,iVar7);
  uVar8 = descriptor.fUnion.fFields.fLength;
  if (-1 < descriptor.fUnion.fStackFields.fLengthAndFlags) {
    uVar8 = (int)descriptor.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  cVar4 = UnicodeString::doCharAt(&descriptor,0);
  cVar5 = UnicodeString::doCharAt(&descriptor,uVar8 + -1);
  if (((ushort)(cVar4 + L'￐') < 10) && (cVar5 != L'x')) {
    iVar9 = 0;
    iVar7 = 0;
    if (0 < (int)uVar8) {
      iVar7 = uVar8;
    }
    cVar4 = L' ';
    newBaseValue = 0;
    for (; offset = iVar7, iVar7 != iVar9; iVar9 = iVar9 + 1) {
      cVar4 = UnicodeString::doCharAt(&descriptor,iVar9);
      if ((ushort)(cVar4 + L'￐') < 10) {
        newBaseValue = (ulong)((ushort)cVar4 - 0x30) + newBaseValue * 10;
      }
      else {
        offset = iVar9;
        if ((cVar4 == L'/') || ((ushort)cVar4 == 0x3e)) break;
        UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar4);
        if (((cVar4 & 0xfffdU) != 0x2c) && (UVar2 == '\0')) goto LAB_0025042b;
      }
    }
    setBaseValue(this,newBaseValue,status);
    if (cVar4 == L'/') {
      cVar4 = L'/';
      iVar7 = 0;
      do {
        offset = offset + 1;
LAB_0025030d:
        if ((int)uVar8 <= offset) {
LAB_002503af:
          this->radix = iVar7;
          if (iVar7 == 0) {
            *status = U_PARSE_ERROR;
          }
          iVar6 = expectedExponent(this);
          this->exponent = iVar6;
          break;
        }
        cVar4 = UnicodeString::doCharAt(&descriptor,offset);
        if (9 < (ushort)(cVar4 + L'￐')) {
          if (cVar4 == L'>') {
            cVar4 = L'>';
            goto LAB_002503af;
          }
          UVar2 = PatternProps::isWhiteSpace((uint)(ushort)cVar4);
          offset = offset + 1;
          if (((cVar4 & 0xfffdU) != 0x2c) && (UVar2 == '\0')) goto LAB_0025042b;
          goto LAB_0025030d;
        }
        iVar7 = iVar7 * 10 + (uint)(ushort)cVar4 + -0x30;
      } while( true );
    }
    if (cVar4 == L'>') {
      while( true ) {
        uVar8 = descriptor.fUnion.fFields.fLength;
        if (-1 < descriptor.fUnion.fStackFields.fLengthAndFlags) {
          uVar8 = (int)descriptor.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if ((int)uVar8 <= offset) break;
        cVar4 = UnicodeString::doCharAt(&descriptor,offset);
        if ((cVar4 != L'>') || (this->exponent < 1)) {
LAB_0025042b:
          *status = U_PARSE_ERROR;
          UnicodeString::~UnicodeString(&descriptor);
          return;
        }
        this->exponent = this->exponent + -1;
        offset = offset + 1;
      }
    }
  }
  else {
    local_b0.p_ = L"-x";
    iVar3 = UnicodeString::compare(&descriptor,&local_b0,2);
    if (iVar3 == '\0') {
      this->baseValue = -1;
    }
    else if (uVar8 == 3) {
      if ((cVar4 == L'0') && (cVar5 == L'x')) {
        this->baseValue = -3;
        this->radix = 10;
        this->exponent = 0;
        cVar4 = UnicodeString::doCharAt(&descriptor,1);
      }
      else if ((cVar4 == L'x') && (cVar5 == L'x')) {
        this->baseValue = -2;
        this->radix = 10;
        this->exponent = 0;
        cVar4 = UnicodeString::doCharAt(&descriptor,1);
      }
      else {
        if ((cVar4 != L'x') || (cVar5 != L'0')) {
          local_b8.p_ = L"NaN";
          iVar3 = UnicodeString::compare(&descriptor,&local_b8,3);
          if (iVar3 == '\0') {
            this->baseValue = -6;
          }
          else {
            local_c0.p_ = L"Inf";
            iVar3 = UnicodeString::compare(&descriptor,&local_c0,3);
            if (iVar3 != '\0') goto LAB_00250476;
            this->baseValue = -5;
          }
          this->radix = 10;
          this->exponent = 0;
          goto LAB_00250476;
        }
        this->baseValue = -4;
        this->radix = 10;
        this->exponent = 0;
        cVar4 = UnicodeString::doCharAt(&descriptor,1);
      }
      this->decimalPoint = cVar4;
    }
  }
LAB_00250476:
  UnicodeString::~UnicodeString(&descriptor);
LAB_00250480:
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  if ((0 < iVar7) && (cVar4 = UnicodeString::doCharAt(description,0), cVar4 == L'\'')) {
    UnicodeString::removeBetween(description,0,1);
  }
  return;
}

Assistant:

void
NFRule::parseRuleDescriptor(UnicodeString& description, UErrorCode& status)
{
    // the description consists of a rule descriptor and a rule body,
    // separated by a colon.  The rule descriptor is optional.  If
    // it's omitted, just set the base value to 0.
    int32_t p = description.indexOf(gColon);
    if (p != -1) {
        // copy the descriptor out into its own string and strip it,
        // along with any trailing whitespace, out of the original
        // description
        UnicodeString descriptor;
        descriptor.setTo(description, 0, p);

        ++p;
        while (p < description.length() && PatternProps::isWhiteSpace(description.charAt(p))) {
            ++p;
        }
        description.removeBetween(0, p);

        // check first to see if the rule descriptor matches the token
        // for one of the special rules.  If it does, set the base
        // value to the correct identifier value
        int descriptorLength = descriptor.length();
        UChar firstChar = descriptor.charAt(0);
        UChar lastChar = descriptor.charAt(descriptorLength - 1);
        if (firstChar >= gZero && firstChar <= gNine && lastChar != gX) {
            // if the rule descriptor begins with a digit, it's a descriptor
            // for a normal rule
            // since we don't have Long.parseLong, and this isn't much work anyway,
            // just build up the value as we encounter the digits.
            int64_t val = 0;
            p = 0;
            UChar c = gSpace;

            // begin parsing the descriptor: copy digits
            // into "tempValue", skip periods, commas, and spaces,
            // stop on a slash or > sign (or at the end of the string),
            // and throw an exception on any other character
            int64_t ll_10 = 10;
            while (p < descriptorLength) {
                c = descriptor.charAt(p);
                if (c >= gZero && c <= gNine) {
                    val = val * ll_10 + (int32_t)(c - gZero);
                }
                else if (c == gSlash || c == gGreaterThan) {
                    break;
                }
                else if (PatternProps::isWhiteSpace(c) || c == gComma || c == gDot) {
                }
                else {
                    // throw new IllegalArgumentException("Illegal character in rule descriptor");
                    status = U_PARSE_ERROR;
                    return;
                }
                ++p;
            }

            // we have the base value, so set it
            setBaseValue(val, status);

            // if we stopped the previous loop on a slash, we're
            // now parsing the rule's radix.  Again, accumulate digits
            // in tempValue, skip punctuation, stop on a > mark, and
            // throw an exception on anything else
            if (c == gSlash) {
                val = 0;
                ++p;
                ll_10 = 10;
                while (p < descriptorLength) {
                    c = descriptor.charAt(p);
                    if (c >= gZero && c <= gNine) {
                        val = val * ll_10 + (int32_t)(c - gZero);
                    }
                    else if (c == gGreaterThan) {
                        break;
                    }
                    else if (PatternProps::isWhiteSpace(c) || c == gComma || c == gDot) {
                    }
                    else {
                        // throw new IllegalArgumentException("Illegal character is rule descriptor");
                        status = U_PARSE_ERROR;
                        return;
                    }
                    ++p;
                }

                // tempValue now contain's the rule's radix.  Set it
                // accordingly, and recalculate the rule's exponent
                radix = (int32_t)val;
                if (radix == 0) {
                    // throw new IllegalArgumentException("Rule can't have radix of 0");
                    status = U_PARSE_ERROR;
                }

                exponent = expectedExponent();
            }

            // if we stopped the previous loop on a > sign, then continue
            // for as long as we still see > signs.  For each one,
            // decrement the exponent (unless the exponent is already 0).
            // If we see another character before reaching the end of
            // the descriptor, that's also a syntax error.
            if (c == gGreaterThan) {
                while (p < descriptor.length()) {
                    c = descriptor.charAt(p);
                    if (c == gGreaterThan && exponent > 0) {
                        --exponent;
                    } else {
                        // throw new IllegalArgumentException("Illegal character in rule descriptor");
                        status = U_PARSE_ERROR;
                        return;
                    }
                    ++p;
                }
            }
        }
        else if (0 == descriptor.compare(gMinusX, 2)) {
            setType(kNegativeNumberRule);
        }
        else if (descriptorLength == 3) {
            if (firstChar == gZero && lastChar == gX) {
                setBaseValue(kProperFractionRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (firstChar == gX && lastChar == gX) {
                setBaseValue(kImproperFractionRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (firstChar == gX && lastChar == gZero) {
                setBaseValue(kMasterRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (descriptor.compare(gNaN, 3) == 0) {
                setBaseValue(kNaNRule, status);
            }
            else if (descriptor.compare(gInf, 3) == 0) {
                setBaseValue(kInfinityRule, status);
            }
        }
    }
    // else use the default base value for now.

    // finally, if the rule body begins with an apostrophe, strip it off
    // (this is generally used to put whitespace at the beginning of
    // a rule's rule text)
    if (description.length() > 0 && description.charAt(0) == gTick) {
        description.removeBetween(0, 1);
    }

    // return the description with all the stuff we've just waded through
    // stripped off the front.  It now contains just the rule body.
    // return description;
}